

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClauseVariantIndex.cpp
# Opt level: O3

void __thiscall
Indexing::HashingClauseVariantIndex::~HashingClauseVariantIndex(HashingClauseVariantIndex *this)

{
  Entry *pEVar1;
  uint uVar2;
  Entry *pEVar3;
  Clause *pCVar4;
  Clause *pCVar5;
  long lVar6;
  ulong uVar7;
  Entry *pEVar8;
  
  (this->super_ClauseVariantIndex)._vptr_ClauseVariantIndex =
       (_func_int **)&PTR__HashingClauseVariantIndex_00b28148;
  pEVar8 = (this->_entries)._entries;
  pEVar3 = (this->_entries)._afterLast;
  if (pEVar8 != pEVar3) {
    uVar2 = (this->_entries)._timestamp;
    do {
      pEVar1 = pEVar8 + 1;
      if (((pEVar8->field_0)._infoData & 1U) == 0 && (uint)(pEVar8->field_0)._infoData >> 2 == uVar2
         ) {
        pCVar4 = (Clause *)pEVar8->_val;
        while (pCVar5 = pCVar4, pCVar5 != (Clause *)0x0) {
          pCVar4 = *(Clause **)&(pCVar5->super_Unit)._inference;
          *(undefined8 *)&pCVar5->super_Unit = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_;
          Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_ = pCVar5;
        }
      }
      pEVar8 = pEVar1;
    } while (pEVar1 != pEVar3);
  }
  pEVar8 = (this->_entries)._entries;
  if (pEVar8 != (Entry *)0x0) {
    lVar6 = (long)(this->_entries)._capacity;
    if (lVar6 == 0) {
      pEVar8->field_0 =
           (anon_union_4_2_6ecd024b_for_Entry_0)Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_4_;
      pEVar8->_key = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._20_4_;
      Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_ = pEVar8;
      return;
    }
    uVar7 = lVar6 * 0x10;
    if (uVar7 < 0x11) {
      pEVar8->field_0 =
           (anon_union_4_2_6ecd024b_for_Entry_0)Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_4_;
      pEVar8->_key = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._44_4_;
      Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_ = pEVar8;
      return;
    }
    if (uVar7 < 0x19) {
      pEVar8->field_0 =
           (anon_union_4_2_6ecd024b_for_Entry_0)Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._64_4_;
      pEVar8->_key = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._68_4_;
      Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_ = pEVar8;
      return;
    }
    if (uVar7 < 0x21) {
      pEVar8->field_0 =
           (anon_union_4_2_6ecd024b_for_Entry_0)Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_4_;
      pEVar8->_key = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._92_4_;
      Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_ = pEVar8;
      return;
    }
    if (uVar7 < 0x31) {
      pEVar8->field_0 =
           (anon_union_4_2_6ecd024b_for_Entry_0)Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_4_;
      pEVar8->_key = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._116_4_;
      Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_ = pEVar8;
      return;
    }
    if (0x40 < uVar7) {
      operator_delete(pEVar8,0x10);
      return;
    }
    pEVar8->field_0 =
         (anon_union_4_2_6ecd024b_for_Entry_0)Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_4_;
    pEVar8->_key = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._140_4_;
    Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_ = pEVar8;
  }
  return;
}

Assistant:

HashingClauseVariantIndex::~HashingClauseVariantIndex()
{
  /*
  unsigned max = 0;
  ClauseList* maxval = 0;
  */

  DHMap<unsigned, ClauseList*>::Iterator iit(_entries);
  while(iit.hasNext()){
    ClauseList* lst = iit.next();

//    unsigned len = lst->length();
//
//    if (len > max) {
//      max = len;
//      maxval->destroy();
//      maxval = lst;
//    } else {
    ClauseList::destroy(lst);
//    }
  }

  /*
  cout << "max bucket of size " << max << endl;
  ClauseList::Iterator it(maxval);
  while (it.hasNext()) {
    Clause* cl = it.next();
    cout << cl->toString() << endl;
  }

  maxval->destroy();
  */
}